

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_single_block_elim_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::LocalSingleBlockLoadStoreElimPass::AllExtensionsSupported
          (LocalSingleBlockLoadStoreElimPass *this)

{
  bool bVar1;
  Op OVar2;
  IRContext *this_00;
  Operand *pOVar3;
  undefined1 local_d0 [8];
  string extension_name;
  Instruction *inst;
  iterator __end2_1;
  iterator __begin2_1;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2_1;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_78;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_70;
  undefined1 local_68 [8];
  string extName;
  Instruction *ei;
  iterator __end2;
  iterator __begin2;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2;
  LocalSingleBlockLoadStoreElimPass *this_local;
  
  Pass::get_module((Pass *)this);
  Module::extensions((Module *)&__begin2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&ei);
  while (bVar1 = utils::operator!=(&__end2.super_iterator,
                                   (iterator_template<spvtools::opt::Instruction> *)&ei), bVar1) {
    extName.field_2._8_8_ =
         utils::IntrusiveList<spvtools::opt::Instruction>::
         iterator_template<spvtools::opt::Instruction>::operator*(&__end2.super_iterator);
    pOVar3 = Instruction::GetInOperand((Instruction *)extName.field_2._8_8_,0);
    Operand::AsString_abi_cxx11_((string *)local_68,pOVar3);
    local_70._M_cur =
         (__node_type *)
         std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(&this->extensions_allowlist_,(key_type *)local_68);
    local_78._M_cur =
         (__node_type *)
         std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->extensions_allowlist_);
    bVar1 = std::__detail::operator==(&local_70,&local_78);
    if (bVar1) {
      this_local._7_1_ = 0;
    }
    std::__cxx11::string::~string((string *)local_68);
    if (bVar1) goto LAB_003e6e37;
    InstructionList::iterator::operator++(&__end2);
  }
  this_00 = Pass::context((Pass *)this);
  IRContext::module(this_00);
  Module::ext_inst_imports((Module *)&__begin2_1);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2_1);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&inst);
  while (bVar1 = utils::operator!=(&__end2_1.super_iterator,
                                   (iterator_template<spvtools::opt::Instruction> *)&inst), bVar1) {
    extension_name.field_2._8_8_ =
         utils::IntrusiveList<spvtools::opt::Instruction>::
         iterator_template<spvtools::opt::Instruction>::operator*(&__end2_1.super_iterator);
    OVar2 = Instruction::opcode((Instruction *)extension_name.field_2._8_8_);
    if (OVar2 != OpExtInstImport) {
      __assert_fail("inst.opcode() == spv::Op::OpExtInstImport && \"Expecting an import of an extension\'s instruction set.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/local_single_block_elim_pass.cpp"
                    ,0xc1,
                    "bool spvtools::opt::LocalSingleBlockLoadStoreElimPass::AllExtensionsSupported() const"
                   );
    }
    pOVar3 = Instruction::GetInOperand((Instruction *)extension_name.field_2._8_8_,0);
    Operand::AsString_abi_cxx11_((string *)local_d0,pOVar3);
    bVar1 = utils::starts_with((string *)local_d0,"NonSemantic.");
    if ((bVar1) &&
       (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_d0,"NonSemantic.Shader.DebugInfo.100"), bVar1)) {
      this_local._7_1_ = 0;
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)local_d0);
    if (bVar1) goto LAB_003e6e37;
    InstructionList::iterator::operator++(&__end2_1);
  }
  this_local._7_1_ = 1;
LAB_003e6e37:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool LocalSingleBlockLoadStoreElimPass::AllExtensionsSupported() const {
  // If any extension not in allowlist, return false
  for (auto& ei : get_module()->extensions()) {
    const std::string extName = ei.GetInOperand(0).AsString();
    if (extensions_allowlist_.find(extName) == extensions_allowlist_.end())
      return false;
  }
  // only allow NonSemantic.Shader.DebugInfo.100, we cannot safely optimise
  // around unknown extended
  // instruction sets even if they are non-semantic
  for (auto& inst : context()->module()->ext_inst_imports()) {
    assert(inst.opcode() == spv::Op::OpExtInstImport &&
           "Expecting an import of an extension's instruction set.");
    const std::string extension_name = inst.GetInOperand(0).AsString();
    if (spvtools::utils::starts_with(extension_name, "NonSemantic.") &&
        extension_name != "NonSemantic.Shader.DebugInfo.100") {
      return false;
    }
  }
  return true;
}